

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

stumpless_param * stumpless_new_param_from_string(char *string)

{
  stumpless_param *mem;
  config_mutex_t *pcVar1;
  char *__s;
  size_t size;
  char *pcVar2;
  size_t value_len;
  char *value;
  size_t i;
  stumpless_param *param;
  char *string_local;
  
  if (string == (char *)0x0) {
    raise_argument_empty("string was NULL");
  }
  else {
    mem = (stumpless_param *)alloc_mem(0x48);
    if (mem != (stumpless_param *)0x0) {
      pcVar1 = thread_safety_new_mutex();
      mem->mutex = pcVar1;
      if (mem->mutex != (void *)0x0) {
        for (value = (char *)0x0; string[(long)value] != '='; value = value + 1) {
          if ((char *)0x1f < value) {
            raise_argument_too_big("length of string exceeded maximum limit",0,(char *)0x0);
            goto LAB_00110454;
          }
          if ((((string[(long)value] < '!') || ('~' < string[(long)value])) ||
              (string[(long)value] == ']')) || (string[(long)value] == '\"')) {
            raise_invalid_param();
            goto LAB_00110454;
          }
          value[(long)mem->name] = string[(long)value];
        }
        mem->name_length = (size_t)value;
        if ((string + 1)[(long)value] == '\"') {
          __s = string + (long)value + 2;
          size = strlen(__s);
          if ((size == 0) || (__s[size - 1] != '\"')) {
            raise_invalid_param();
          }
          else {
            pcVar2 = (char *)alloc_mem(size);
            mem->value = pcVar2;
            if (mem->value != (char *)0x0) {
              memcpy(mem->value,__s,size - 1);
              mem->value[size - 1] = '\0';
              mem->value_length = size - 1;
              clear_error();
              return mem;
            }
          }
        }
        else {
          raise_invalid_param();
        }
      }
LAB_00110454:
      free_mem(mem);
    }
  }
  return (stumpless_param *)0x0;
}

Assistant:

struct stumpless_param *
stumpless_new_param_from_string( const char *string ) {
  struct stumpless_param *param;
  size_t i;
  const char *value;
  size_t value_len;

  VALIDATE_ARG_NOT_NULL( string );

  param = alloc_mem( sizeof( *param ) );
  if( !param ){
    return NULL;
  }

  // this setup should be consolidated once the load param function
  // is able to accept string references instead of only NULL-terminated strings
  config_assign_cached_mutex( param->mutex );
  if( !config_check_mutex_valid( param->mutex ) ) {
    goto fail;
  }
  config_init_journald_param( param );

  // validate and load the param name
  for( i = 0; string[i] != '='; i++ ){
    if( i >= STUMPLESS_MAX_PARAM_NAME_LENGTH ){
      raise_argument_too_big( L10N_STRING_TOO_LONG_ERROR_MESSAGE,
                              0,
                              NULL );
      goto fail;
    }

    if( string[i] < 33 ||
        string[i] > 126 ||
        string[i] == ']' ||
        string[i] == '"' ){
      raise_invalid_param();
      goto fail;
    }

    param->name[i] = string[i];
  }
  param->name_length = i;
  
  // validate the character after the '=' is '"'
  if( string[i + 1] != '"' ){
    raise_invalid_param();
    goto fail;
  }

  value = string + i + 2;
  value_len = strlen( value );

  // validate the final character is '"'
  if( value_len == 0 || value[value_len-1] != '"' ){
    raise_invalid_param();
    goto fail;
  }

  // we're going to replace the ending '"' with a null character
  param->value = alloc_mem( value_len );
  if( !param->value ){
    goto fail;
  }

  memcpy( param->value, value, value_len - 1 );
  param->value[value_len-1] = '\0';
  param->value_length = value_len - 1;

  clear_error();
  return param;

fail:
  free_mem( param );
  return NULL;
}